

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O0

bool __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::checkSourceTextureSizeAndType
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,GLenum target)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  Enum<int,_2UL> EVar5;
  bool local_342;
  bool local_341;
  bool local_340;
  bool local_33f;
  bool local_33e;
  bool local_33d;
  bool local_33c;
  bool local_33b;
  bool local_33a;
  bool local_339;
  Enum<int,_2UL> local_310;
  GetNameFunc local_300;
  int local_2f8;
  Enum<int,_2UL> local_2f0;
  GetNameFunc local_2e0;
  int local_2d8;
  Enum<int,_2UL> local_2d0;
  GetNameFunc local_2c0;
  int local_2b8;
  Enum<int,_2UL> local_2b0;
  GetNameFunc local_2a0;
  int local_298;
  Enum<int,_2UL> local_290;
  GetNameFunc local_280;
  int local_278;
  Enum<int,_2UL> local_270;
  GetNameFunc local_260;
  int local_258;
  Enum<int,_2UL> local_250;
  GetNameFunc local_240;
  int local_238;
  Enum<int,_2UL> local_230;
  GetNameFunc local_220;
  int local_218;
  Enum<int,_2UL> local_210;
  GetNameFunc local_200;
  int local_1f8;
  Enum<int,_2UL> local_1f0 [2];
  MessageBuilder local_1d0;
  bool local_4d;
  GLenum local_4c;
  GLenum GStack_48;
  bool is_ok;
  GLint depth_type;
  GLint alpha_type;
  GLint blue_type;
  GLint green_type;
  GLint red_type;
  GLint stencil_size;
  GLint depth_size;
  GLint alpha_size;
  GLint green_size;
  GLint blue_size;
  GLint red_size;
  Functions *gl;
  FunctionalTest *pFStack_10;
  GLenum target_local;
  FunctionalTest *this_local;
  
  gl._4_4_ = target;
  pFStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _blue_size = CONCAT44(extraout_var,iVar1);
  green_size = 0;
  alpha_size = 0;
  depth_size = 0;
  stencil_size = 0;
  red_type = 0;
  green_type = 0;
  blue_type = 0;
  alpha_type = 0;
  depth_type = 0;
  GStack_48 = 0;
  local_4c = 0;
  (**(code **)(_blue_size + 0xb8))(gl._4_4_,this->m_source_texture);
  dVar2 = (**(code **)(_blue_size + 0x800))();
  glu::checkError(dVar2,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x1fb);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x805c,&green_size);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x805d,&depth_size);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x805e,&alpha_size);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x805f,&stencil_size);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x884a,&red_type);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x88f1,&green_type);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x8c10,&blue_type);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x8c11,&alpha_type);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x8c12,&depth_type);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x8c13,&stack0xffffffffffffffb8);
  (**(code **)(_blue_size + 0xab0))(gl._4_4_,0,0x8c16,&local_4c);
  dVar2 = (**(code **)(_blue_size + 0x800))();
  glu::checkError(dVar2,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x20b);
  local_339 = false;
  if (descriptor.min_red_size <= green_size) {
    local_339 = descriptor.min_green_size <= depth_size;
  }
  local_33a = false;
  if (local_339) {
    local_33a = descriptor.min_blue_size <= alpha_size;
  }
  local_33b = false;
  if (local_33a) {
    local_33b = descriptor.min_alpha_size <= stencil_size;
  }
  local_33c = false;
  if (local_33b) {
    local_33c = descriptor.min_depth_size <= red_type;
  }
  local_33d = false;
  if (local_33c) {
    local_33d = descriptor.min_stencil_size <= green_type;
  }
  local_33e = false;
  if (local_33d) {
    local_33e = blue_type == descriptor.expected_red_type;
  }
  local_33f = false;
  if (local_33e) {
    local_33f = alpha_type == descriptor.expected_green_type;
  }
  local_340 = false;
  if (local_33f) {
    local_340 = depth_type == descriptor.expected_blue_type;
  }
  local_341 = false;
  if (local_340) {
    local_341 = GStack_48 == descriptor.expected_alpha_type;
  }
  local_342 = false;
  if (local_341) {
    local_342 = local_4c == descriptor.expected_depth_type;
  }
  local_4d = local_342;
  if (local_342 == false) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1d0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1d0,(char (*) [32])"Promotion from internal format ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&descriptor.internal_format_name);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [53])" have failed during glGetTexLevelParameteriv query. "
                       );
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])"Expected red size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&descriptor.min_red_size);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])", expected green size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&descriptor.min_green_size);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [24])", expected blue size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&descriptor.min_blue_size);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])", expected alpha size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&descriptor.min_alpha_size);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])", expected depth size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&descriptor.min_depth_size);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [27])", expected stencil size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&descriptor.min_stencil_size);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [22])". Queried red size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&green_size);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [24])", queried green size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&depth_size);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])", queried blue size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&alpha_size);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [24])", queried alpha size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stencil_size);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [24])", queried depth size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&red_type);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [26])", queried stencil size = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&green_type);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2b17bfb);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])"Expected red type = ");
    EVar5 = glu::getTypeStr(descriptor.expected_red_type);
    local_200 = EVar5.m_getName;
    local_1f8 = EVar5.m_value;
    local_1f0[0].m_getName = local_200;
    local_1f0[0].m_value = local_1f8;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1f0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])", expected green type = ");
    EVar5 = glu::getTypeStr(descriptor.expected_green_type);
    local_220 = EVar5.m_getName;
    local_218 = EVar5.m_value;
    local_210.m_getName = local_220;
    local_210.m_value = local_218;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_210);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [24])", expected blue type = ");
    EVar5 = glu::getTypeStr(descriptor.expected_blue_type);
    local_240 = EVar5.m_getName;
    local_238 = EVar5.m_value;
    local_230.m_getName = local_240;
    local_230.m_value = local_238;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_230);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])", expected alpha type = ");
    EVar5 = glu::getTypeStr(descriptor.expected_alpha_type);
    local_260 = EVar5.m_getName;
    local_258 = EVar5.m_value;
    local_250.m_getName = local_260;
    local_250.m_value = local_258;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_250);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])", expected depth type = ");
    EVar5 = glu::getTypeStr(descriptor.expected_depth_type);
    local_280 = EVar5.m_getName;
    local_278 = EVar5.m_value;
    local_270.m_getName = local_280;
    local_270.m_value = local_278;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_270);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [22])". Queried red type = ");
    EVar5 = glu::getTypeStr(blue_type);
    local_2a0 = EVar5.m_getName;
    local_298 = EVar5.m_value;
    local_290.m_getName = local_2a0;
    local_290.m_value = local_298;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_290);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [24])", queried green type = ");
    EVar5 = glu::getTypeStr(alpha_type);
    local_2c0 = EVar5.m_getName;
    local_2b8 = EVar5.m_value;
    local_2b0.m_getName = local_2c0;
    local_2b0.m_value = local_2b8;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2b0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])", queried blue type = ");
    EVar5 = glu::getTypeStr(depth_type);
    local_2e0 = EVar5.m_getName;
    local_2d8 = EVar5.m_value;
    local_2d0.m_getName = local_2e0;
    local_2d0.m_value = local_2d8;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2d0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [24])", queried alpha type = ");
    EVar5 = glu::getTypeStr(GStack_48);
    local_300 = EVar5.m_getName;
    local_2f8 = EVar5.m_value;
    local_2f0.m_getName = local_300;
    local_2f0.m_value = local_2f8;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2f0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [24])", queried depth type = ");
    EVar5 = glu::getTypeStr(local_4c);
    local_310.m_getName = EVar5.m_getName;
    local_310.m_value = EVar5.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_310);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  }
  return (bool)(local_4d & 1);
}

Assistant:

bool FunctionalTest::checkSourceTextureSizeAndType(TextureInternalFormatDescriptor descriptor, glw::GLenum target)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* query result storage */
	glw::GLint red_size		= 0;
	glw::GLint blue_size	= 0;
	glw::GLint green_size   = 0;
	glw::GLint alpha_size   = 0;
	glw::GLint depth_size   = 0;
	glw::GLint stencil_size = 0;

	glw::GLint red_type   = 0;
	glw::GLint green_type = 0;
	glw::GLint blue_type  = 0;
	glw::GLint alpha_type = 0;
	glw::GLint depth_type = 0;

	/* Bind texture */
	gl.bindTexture(target, m_source_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	/* queries */
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_RED_SIZE, &red_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_GREEN_SIZE, &green_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_BLUE_SIZE, &blue_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_ALPHA_SIZE, &alpha_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_DEPTH_SIZE, &depth_size);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_STENCIL_SIZE, &stencil_size);

	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_RED_TYPE, &red_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_GREEN_TYPE, &green_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_BLUE_TYPE, &blue_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_ALPHA_TYPE, &alpha_type);
	gl.getTexLevelParameteriv(target, 0, GL_TEXTURE_DEPTH_TYPE, &depth_type);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	/* check expected values */
	bool is_ok = true;

	is_ok = is_ok && (red_size >= descriptor.min_red_size);
	is_ok = is_ok && (green_size >= descriptor.min_green_size);
	is_ok = is_ok && (blue_size >= descriptor.min_blue_size);
	is_ok = is_ok && (alpha_size >= descriptor.min_alpha_size);
	is_ok = is_ok && (depth_size >= descriptor.min_depth_size);
	is_ok = is_ok && (stencil_size >= descriptor.min_stencil_size);

	is_ok = is_ok && ((glw::GLenum)red_type == descriptor.expected_red_type);
	is_ok = is_ok && ((glw::GLenum)green_type == descriptor.expected_green_type);
	is_ok = is_ok && ((glw::GLenum)blue_type == descriptor.expected_blue_type);
	is_ok = is_ok && ((glw::GLenum)alpha_type == descriptor.expected_alpha_type);
	is_ok = is_ok && ((glw::GLenum)depth_type == descriptor.expected_depth_type);

	/* Log on failure. */
	if (!is_ok)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Promotion from internal format " << descriptor.internal_format_name
			<< " have failed during glGetTexLevelParameteriv query. "
			<< "Expected red size = " << descriptor.min_red_size
			<< ", expected green size = " << descriptor.min_green_size
			<< ", expected blue size = " << descriptor.min_blue_size
			<< ", expected alpha size = " << descriptor.min_alpha_size
			<< ", expected depth size = " << descriptor.min_depth_size
			<< ", expected stencil size = " << descriptor.min_stencil_size << ". Queried red size = " << red_size
			<< ", queried green size = " << green_size << ", queried blue size = " << blue_size
			<< ", queried alpha size = " << alpha_size << ", queried depth size = " << depth_size
			<< ", queried stencil size = " << stencil_size << ". "
			<< "Expected red type = " << glu::getTypeStr(descriptor.expected_red_type)
			<< ", expected green type = " << glu::getTypeStr(descriptor.expected_green_type)
			<< ", expected blue type = " << glu::getTypeStr(descriptor.expected_blue_type)
			<< ", expected alpha type = " << glu::getTypeStr(descriptor.expected_alpha_type)
			<< ", expected depth type = " << glu::getTypeStr(descriptor.expected_depth_type)
			<< ". Queried red type = " << glu::getTypeStr(red_type)
			<< ", queried green type = " << glu::getTypeStr(green_type)
			<< ", queried blue type = " << glu::getTypeStr(blue_type)
			<< ", queried alpha type = " << glu::getTypeStr(alpha_type)
			<< ", queried depth type = " << glu::getTypeStr(depth_type) << "." << tcu::TestLog::EndMessage;
	}

	/* return results. */
	return is_ok;
}